

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

int __thiscall google::protobuf::Fls128(protobuf *this,uint128 n)

{
  int iVar1;
  int in_EAX;
  int iVar2;
  uint uVar3;
  LogMessage *other;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  protobuf *ppVar7;
  protobuf *ppVar8;
  ulong uVar9;
  LogMessage local_58;
  LogFinisher local_19;
  
  uVar9 = n.lo_;
  if (uVar9 != 0) {
    uVar5 = uVar9 >> 0x20;
    uVar6 = uVar5;
    if (uVar5 == 0) {
      uVar6 = uVar9;
    }
    iVar2 = (uint)(uVar5 != 0) * 0x20;
    uVar5 = uVar6 >> 0x10 & 0xffff;
    iVar1 = iVar2 + 0x10;
    if (uVar6 < 0x10000) {
      uVar5 = uVar6 & 0xffffffff;
      iVar1 = iVar2;
    }
    uVar3 = (uint)(uVar5 >> 8);
    iVar2 = iVar1 + 8;
    if ((uint)uVar5 < 0x100) {
      uVar3 = (uint)uVar5;
      iVar2 = iVar1;
    }
    uVar4 = uVar3 >> 4;
    iVar1 = iVar2 + 4;
    if (uVar3 < 0x10) {
      uVar4 = uVar3;
      iVar1 = iVar2;
    }
    in_EAX = ((uint)(0x3333333322221100 >> ((byte)(uVar4 << 2) & 0x3f)) & 3) + iVar1 + 0x40;
  }
  if (uVar9 == 0) {
    if (this == (protobuf *)0x0) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/int128.cc"
                 ,0x3f);
      other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (0) != (n): ");
      internal::LogFinisher::operator=(&local_19,other);
      internal::LogMessage::~LogMessage(&local_58);
    }
    ppVar7 = (protobuf *)((ulong)this >> 0x20);
    ppVar8 = ppVar7;
    if (ppVar7 == (protobuf *)0x0) {
      ppVar8 = this;
    }
    iVar2 = (uint)(ppVar7 != (protobuf *)0x0) * 0x20;
    uVar9 = (ulong)ppVar8 >> 0x10 & 0xffff;
    iVar1 = iVar2 + 0x10;
    if (ppVar8 < (protobuf *)0x10000) {
      uVar9 = (ulong)ppVar8 & 0xffffffff;
      iVar1 = iVar2;
    }
    uVar3 = (uint)(uVar9 >> 8);
    iVar2 = iVar1 + 8;
    if ((uint)uVar9 < 0x100) {
      uVar3 = (uint)uVar9;
      iVar2 = iVar1;
    }
    uVar4 = uVar3 >> 4;
    iVar1 = iVar2 + 4;
    if (uVar3 < 0x10) {
      uVar4 = uVar3;
      iVar1 = iVar2;
    }
    in_EAX = ((uint)(0x3333333322221100 >> ((byte)(uVar4 << 2) & 0x3f)) & 3) + iVar1;
  }
  return in_EAX;
}

Assistant:

static inline int Fls128(uint128 n) {
  if (uint64 hi = Uint128High64(n)) {
    return Fls64(hi) + 64;
  }
  return Fls64(Uint128Low64(n));
}